

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::populateDefaultShadersAndRules(GLEngine *this)

{
  pointer pSVar1;
  undefined1 *puVar2;
  GLEngine *pGVar3;
  long lVar4;
  __hashtable *__h_21;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  *puVar5;
  initializer_list<polyscope::render::ShaderStageSpecification> __l;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_00;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_01;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_02;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_03;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_04;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_05;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_06;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_07;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_08;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_09;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_10;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_11;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_12;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_13;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_14;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_15;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_16;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_17;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_18;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_19;
  __hashtable *__h;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  vStack_248;
  undefined1 auStack_230 [16];
  undefined1 local_220 [24];
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_208;
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  local_200;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [24];
  undefined1 local_1a8 [24];
  _Alloc_hider local_190;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  local_188;
  undefined1 local_170 [24];
  undefined1 local_158 [32];
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  local_138;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined4 local_100;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  local_f8;
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  local_e0;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  local_c8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  local_90;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  *local_50;
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  *local_48;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  *local_40;
  GLEngine *local_38;
  
  local_1e0._0_4_ = FLEX_MESH_VERT_SHADER;
  auStack_230._0_8_ = 0x20b5c8;
  local_38 = this;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c33b8);
  auStack_230._0_8_ = 0x20b5da;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c33d0);
  auStack_230._0_8_ = 0x20b5ef;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c33e8);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20b615;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c3400,DAT_004c3408 + DAT_004c3400);
  local_170._0_4_ = FLEX_MESH_FRAG_SHADER;
  auStack_230._0_8_ = 0x20b63f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3428);
  auStack_230._0_8_ = 0x20b653;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3440);
  auStack_230._0_8_ = 0x20b667;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c3458);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20b68b;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c3470,DAT_004c3478 + DAT_004c3470);
  auStack_230._0_8_ = 0x20b6a7;
  __l._M_len = 2;
  __l._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20b6b6;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  pGVar3 = local_38;
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20b6de;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[5],_true>(&local_90,(char (*) [5])"MESH",&local_200);
  local_208 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&pGVar3->registeredShaderPrograms;
  auStack_230._0_8_ = 0x20b6f7;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20b707;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20b71d;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20b727;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20b731;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20b749;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20b753;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20b75d;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20b767;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = FLEX_SPHERE_VERT_SHADER;
  auStack_230._0_8_ = 0x20b78e;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3bd8);
  auStack_230._0_8_ = 0x20b79f;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3bf0);
  auStack_230._0_8_ = 0x20b7b3;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c3c08);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20b7d6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c3c20,DAT_004c3c28 + DAT_004c3c20);
  local_170._0_4_ = FLEX_SPHERE_GEOM_SHADER;
  auStack_230._0_8_ = 0x20b800;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3c48);
  auStack_230._0_8_ = 0x20b814;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3c60);
  auStack_230._0_8_ = 0x20b828;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c3c78);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20b84b;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c3c90,DAT_004c3c98 + DAT_004c3c90);
  local_100 = FLEX_SPHERE_FRAG_SHADER;
  auStack_230._0_8_ = 0x20b875;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_f8,
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3cb8);
  auStack_230._0_8_ = 0x20b889;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector(&local_e0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3cd0);
  auStack_230._0_8_ = 0x20b89d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_c8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c3ce8);
  local_b0[0] = local_a0;
  auStack_230._0_8_ = 0x20b8c1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,DAT_004c3d00,DAT_004c3d08 + DAT_004c3d00);
  auStack_230._0_8_ = 0x20b8dd;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_00,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20b8ec;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Points;
  auStack_230._0_8_ = 0x20b90c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>(&local_90,(char (*) [15])"RAYCAST_SPHERE",&local_200);
  auStack_230._0_8_ = 0x20b91e;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20b92e;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20b944;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20b94e;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20b958;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0x150;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20b970;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20b97a;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20b984;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20b98e;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = FLEX_VECTOR_VERT_SHADER;
  auStack_230._0_8_ = 0x20b9b5;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3950);
  auStack_230._0_8_ = 0x20b9c6;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3968);
  auStack_230._0_8_ = 0x20b9da;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c3980);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20b9fd;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c3998,DAT_004c39a0 + DAT_004c3998);
  local_170._0_4_ = FLEX_VECTOR_GEOM_SHADER;
  auStack_230._0_8_ = 0x20ba27;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c39c0);
  auStack_230._0_8_ = 0x20ba3b;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c39d8);
  auStack_230._0_8_ = 0x20ba4f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c39f0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20ba72;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c3a08,DAT_004c3a10 + DAT_004c3a08);
  local_100 = FLEX_VECTOR_FRAG_SHADER;
  auStack_230._0_8_ = 0x20ba9c;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_f8,
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3a30);
  auStack_230._0_8_ = 0x20bab0;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector(&local_e0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3a48);
  auStack_230._0_8_ = 0x20bac4;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_c8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c3a60);
  local_b0[0] = local_a0;
  auStack_230._0_8_ = 0x20bae7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,DAT_004c3a78,DAT_004c3a80 + DAT_004c3a78);
  auStack_230._0_8_ = 0x20bb03;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_01,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20bb12;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Points;
  auStack_230._0_8_ = 0x20bb32;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>(&local_90,(char (*) [15])"RAYCAST_VECTOR",&local_200);
  auStack_230._0_8_ = 0x20bb44;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20bb54;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20bb6a;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20bb74;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20bb7e;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0x150;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20bb96;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20bba0;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20bbaa;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20bbb4;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = FLEX_CYLINDER_VERT_SHADER;
  auStack_230._0_8_ = 0x20bbdb;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c41e8);
  auStack_230._0_8_ = 0x20bbec;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c4200);
  auStack_230._0_8_ = 0x20bc00;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c4218);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20bc23;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c4230,DAT_004c4238 + DAT_004c4230);
  local_170._0_4_ = FLEX_CYLINDER_GEOM_SHADER;
  auStack_230._0_8_ = 0x20bc4d;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c4258);
  auStack_230._0_8_ = 0x20bc61;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c4270);
  auStack_230._0_8_ = 0x20bc75;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c4288);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20bc98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c42a0,DAT_004c42a8 + DAT_004c42a0);
  local_100 = FLEX_CYLINDER_FRAG_SHADER;
  auStack_230._0_8_ = 0x20bcc2;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_f8,
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c42c8);
  auStack_230._0_8_ = 0x20bcd6;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector(&local_e0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c42e0);
  auStack_230._0_8_ = 0x20bcea;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_c8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c42f8);
  local_b0[0] = local_a0;
  auStack_230._0_8_ = 0x20bd0d;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,DAT_004c4310,DAT_004c4318 + DAT_004c4310);
  auStack_230._0_8_ = 0x20bd29;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_02,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20bd38;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Points;
  auStack_230._0_8_ = 0x20bd58;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[17],_true>(&local_90,(char (*) [17])"RAYCAST_CYLINDER",&local_200);
  auStack_230._0_8_ = 0x20bd6a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20bd7a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20bd90;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20bd9a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20bda4;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0x150;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20bdbc;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20bdc6;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20bdd0;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20bdda;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = HISTOGRAM_VERT_SHADER;
  auStack_230._0_8_ = 0x20be01;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3220);
  auStack_230._0_8_ = 0x20be12;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3238);
  auStack_230._0_8_ = 0x20be26;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c3250);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20be49;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c3268,DAT_004c3270 + DAT_004c3268);
  local_170._0_4_ = HISTOGRAM_FRAG_SHADER;
  auStack_230._0_8_ = 0x20be73;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3290);
  auStack_230._0_8_ = 0x20be87;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c32a8);
  auStack_230._0_8_ = 0x20be9b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c32c0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20bebe;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c32d8,DAT_004c32e0 + DAT_004c32d8);
  auStack_230._0_8_ = 0x20beda;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_03,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20bee9;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20bf09;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[10],_true>(&local_90,(char (*) [10])"HISTOGRAM",&local_200);
  auStack_230._0_8_ = 0x20bf1b;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20bf2b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20bf41;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20bf4b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20bf55;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20bf6d;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20bf77;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20bf81;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20bf8b;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = GROUND_PLANE_VERT_SHADER;
  local_40 = (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
              *)&DAT_004c2cb0;
  auStack_230._0_8_ = 0x20bfba;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2cb0);
  local_48 = (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
              *)&DAT_004c2cc8;
  auStack_230._0_8_ = 0x20bfd4;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2cc8);
  local_50 = (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
              *)&DAT_004c2ce0;
  auStack_230._0_8_ = 0x20bff1;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2ce0);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20c016;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2cf8,DAT_004c2d00 + DAT_004c2cf8);
  local_170._0_4_ = GROUND_PLANE_TILE_FRAG_SHADER;
  auStack_230._0_8_ = 0x20c040;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2d20);
  auStack_230._0_8_ = 0x20c054;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2d38);
  auStack_230._0_8_ = 0x20c068;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2d50);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20c08b;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2d68,DAT_004c2d70 + DAT_004c2d68);
  auStack_230._0_8_ = 0x20c0a7;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_04,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20c0b6;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20c0d6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>(&local_90,(char (*) [18])"GROUND_PLANE_TILE",&local_200);
  auStack_230._0_8_ = 0x20c0e8;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20c0f8;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20c10e;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20c118;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20c122;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20c13a;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20c144;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20c14e;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20c158;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = GROUND_PLANE_VERT_SHADER;
  auStack_230._0_8_ = 0x20c17b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20c190;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20c1a8;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20c1cd;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2cf8,DAT_004c2d00 + DAT_004c2cf8);
  local_170._0_4_ = GROUND_PLANE_TILE_REFLECT_FRAG_SHADER;
  auStack_230._0_8_ = 0x20c1f7;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2d90);
  auStack_230._0_8_ = 0x20c20b;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2da8);
  auStack_230._0_8_ = 0x20c21f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2dc0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20c242;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2dd8,DAT_004c2de0 + DAT_004c2dd8);
  auStack_230._0_8_ = 0x20c25e;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_05,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20c26d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20c28d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[26],_true>(&local_90,(char (*) [26])"GROUND_PLANE_TILE_REFLECT",&local_200);
  auStack_230._0_8_ = 0x20c29f;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20c2af;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20c2c5;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20c2cf;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20c2d9;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20c2f1;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20c2fb;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20c305;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20c30f;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = GROUND_PLANE_VERT_SHADER;
  auStack_230._0_8_ = 0x20c332;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20c347;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20c35f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20c384;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2cf8,DAT_004c2d00 + DAT_004c2cf8);
  local_170._0_4_ = GROUND_PLANE_SHADOW_FRAG_SHADER;
  auStack_230._0_8_ = 0x20c3af;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2e00);
  auStack_230._0_8_ = 0x20c3c4;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2e18);
  auStack_230._0_8_ = 0x20c3d9;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2e30);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20c3fe;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2e48,DAT_004c2e50 + DAT_004c2e48);
  auStack_230._0_8_ = 0x20c41a;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_06,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20c429;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20c449;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[20],_true>(&local_90,(char (*) [20])"GROUND_PLANE_SHADOW",&local_200);
  auStack_230._0_8_ = 0x20c45b;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20c46b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20c481;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20c48b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20c495;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20c4ad;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20c4b7;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20c4c1;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20c4cb;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  local_40 = (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
              *)&DAT_004c2200;
  auStack_230._0_8_ = 0x20c4fa;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2200);
  local_48 = (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
              *)&DAT_004c2218;
  auStack_230._0_8_ = 0x20c514;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2218);
  local_50 = (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
              *)&DAT_004c2230;
  auStack_230._0_8_ = 0x20c531;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2230);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20c556;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = MAP_LIGHT_FRAG_SHADER;
  auStack_230._0_8_ = 0x20c580;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2788);
  auStack_230._0_8_ = 0x20c594;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c27a0);
  auStack_230._0_8_ = 0x20c5a8;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c27b8);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20c5cb;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c27d0,DAT_004c27d8 + DAT_004c27d0);
  auStack_230._0_8_ = 0x20c5e7;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_07,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20c5f6;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20c616;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[10],_true>(&local_90,(char (*) [10])"MAP_LIGHT",&local_200);
  auStack_230._0_8_ = 0x20c628;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20c638;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20c64e;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20c658;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20c662;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20c67a;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20c684;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20c68e;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20c698;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = RIBBON_VERT_SHADER;
  auStack_230._0_8_ = 0x20c6be;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3fe0);
  auStack_230._0_8_ = 0x20c6cf;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3ff8);
  auStack_230._0_8_ = 0x20c6e3;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c4010);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20c706;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c4028,DAT_004c4030 + DAT_004c4028);
  local_170._0_4_ = RIBBON_GEOM_SHADER;
  auStack_230._0_8_ = 0x20c730;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c4050);
  auStack_230._0_8_ = 0x20c744;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c4068);
  auStack_230._0_8_ = 0x20c758;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c4080);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20c77b;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c4098,DAT_004c40a0 + DAT_004c4098);
  local_100 = RIBBON_FRAG_SHADER;
  auStack_230._0_8_ = 0x20c7a5;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_f8,
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c40c0);
  auStack_230._0_8_ = 0x20c7b9;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector(&local_e0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c40d8);
  auStack_230._0_8_ = 0x20c7cd;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_c8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c40f0);
  local_b0[0] = local_a0;
  auStack_230._0_8_ = 0x20c7f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,DAT_004c4108,DAT_004c4110 + DAT_004c4108);
  auStack_230._0_8_ = 0x20c80c;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_08,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20c81b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = IndexedLineStripAdjacency;
  auStack_230._0_8_ = 0x20c83b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[7],_true>(&local_90,(char (*) [7])"RIBBON",&local_200);
  auStack_230._0_8_ = 0x20c84d;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20c85d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20c873;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20c87d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20c887;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0x150;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20c89f;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20c8a9;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20c8b3;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20c8bd;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = SLICE_PLANE_VERT_SHADER;
  auStack_230._0_8_ = 0x20c8e3;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c3088);
  auStack_230._0_8_ = 0x20c8f4;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c30a0);
  auStack_230._0_8_ = 0x20c908;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c30b8);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20c92b;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c30d0,DAT_004c30d8 + DAT_004c30d0);
  local_170._0_4_ = SLICE_PLANE_FRAG_SHADER;
  auStack_230._0_8_ = 0x20c955;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c30f8);
  auStack_230._0_8_ = 0x20c969;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c3110);
  auStack_230._0_8_ = 0x20c97d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c3128);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20c9a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c3140,DAT_004c3148 + DAT_004c3140);
  auStack_230._0_8_ = 0x20c9bc;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_09,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20c9cb;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20c9eb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[12],_true>(&local_90,(char (*) [12])"SLICE_PLANE",&local_200);
  auStack_230._0_8_ = 0x20c9fd;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20ca0d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20ca23;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20ca2d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20ca37;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20ca4f;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20ca59;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20ca63;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20ca6d;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20ca90;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20caa5;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20cabd;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20cae2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = PLAIN_TEXTURE_DRAW_FRAG_SHADER;
  auStack_230._0_8_ = 0x20cb0c;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c22e0);
  auStack_230._0_8_ = 0x20cb20;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c22f8);
  auStack_230._0_8_ = 0x20cb34;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2310);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20cb57;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2328,DAT_004c2330 + DAT_004c2328);
  auStack_230._0_8_ = 0x20cb73;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_10,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20cb82;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20cba2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[19],_true>(&local_90,(char (*) [19])"TEXTURE_DRAW_PLAIN",&local_200);
  auStack_230._0_8_ = 0x20cbb4;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20cbc4;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20cbda;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20cbe4;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20cbee;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20cc06;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20cc10;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20cc1a;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20cc24;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20cc47;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20cc5c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20cc74;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20cc99;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = DOT3_TEXTURE_DRAW_FRAG_SHADER;
  auStack_230._0_8_ = 0x20ccc3;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2350);
  auStack_230._0_8_ = 0x20ccd7;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2368);
  auStack_230._0_8_ = 0x20cceb;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2380);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20cd0e;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2398,DAT_004c23a0 + DAT_004c2398);
  auStack_230._0_8_ = 0x20cd2a;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_11,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20cd39;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20cd59;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>(&local_90,(char (*) [18])"TEXTURE_DRAW_DOT3",&local_200);
  auStack_230._0_8_ = 0x20cd6b;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20cd7b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20cd91;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20cd9b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20cda5;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20cdbd;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20cdc7;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20cdd1;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20cddb;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20cdfe;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20ce13;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20ce2b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20ce50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = MAP3_TEXTURE_DRAW_FRAG_SHADER;
  auStack_230._0_8_ = 0x20ce7a;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c23c0);
  auStack_230._0_8_ = 0x20ce8e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c23d8);
  auStack_230._0_8_ = 0x20cea2;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c23f0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20cec5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2408,DAT_004c2410 + DAT_004c2408);
  auStack_230._0_8_ = 0x20cee1;
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_12,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20cef0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20cf10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>(&local_90,(char (*) [18])"TEXTURE_DRAW_MAP3",&local_200);
  auStack_230._0_8_ = 0x20cf22;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20cf32;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20cf48;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20cf52;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20cf5c;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20cf74;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20cf7e;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20cf88;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20cf92;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = SPHEREBG_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20cfb8;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2270);
  auStack_230._0_8_ = 0x20cfc9;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2288);
  auStack_230._0_8_ = 0x20cfdd;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c22a0);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20d000;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c22b8,DAT_004c22c0 + DAT_004c22b8);
  local_170._0_4_ = SPHEREBG_DRAW_FRAG_SHADER;
  auStack_230._0_8_ = 0x20d02a;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2430);
  auStack_230._0_8_ = 0x20d03e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2448);
  auStack_230._0_8_ = 0x20d052;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2460);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20d075;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2478,DAT_004c2480 + DAT_004c2478);
  auStack_230._0_8_ = 0x20d091;
  __l_13._M_len = 2;
  __l_13._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_13,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20d0a0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20d0c0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[22],_true>(&local_90,(char (*) [22])"TEXTURE_DRAW_SPHEREBG",&local_200);
  auStack_230._0_8_ = 0x20d0d2;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20d0e2;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20d0f8;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20d102;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20d10c;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20d124;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20d12e;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20d138;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20d142;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20d165;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20d17a;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20d192;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20d1b7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = COMPOSITE_PEEL;
  auStack_230._0_8_ = 0x20d1e1;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c24a0);
  auStack_230._0_8_ = 0x20d1f5;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c24b8);
  auStack_230._0_8_ = 0x20d209;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c24d0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20d22c;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c24e8,DAT_004c24f0 + DAT_004c24e8);
  auStack_230._0_8_ = 0x20d248;
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_14,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20d257;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20d277;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>(&local_90,(char (*) [15])"COMPOSITE_PEEL",&local_200);
  auStack_230._0_8_ = 0x20d289;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20d299;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20d2af;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20d2b9;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20d2c3;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20d2db;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20d2e5;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20d2ef;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20d2f9;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20d31c;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20d331;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20d349;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20d36e;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = DEPTH_COPY;
  auStack_230._0_8_ = 0x20d398;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2510);
  auStack_230._0_8_ = 0x20d3ac;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2528);
  auStack_230._0_8_ = 0x20d3c0;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2540);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20d3e3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2558,DAT_004c2560 + DAT_004c2558);
  auStack_230._0_8_ = 0x20d3ff;
  __l_15._M_len = 2;
  __l_15._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_15,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20d40e;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20d42e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[11],_true>(&local_90,(char (*) [11])"DEPTH_COPY",&local_200);
  auStack_230._0_8_ = 0x20d440;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20d450;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20d466;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20d470;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20d47a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20d492;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20d49c;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20d4a6;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20d4b0;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20d4d3;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20d4e8;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20d500;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20d525;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = DEPTH_TO_MASK;
  auStack_230._0_8_ = 0x20d54f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2580);
  auStack_230._0_8_ = 0x20d563;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2598);
  auStack_230._0_8_ = 0x20d577;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c25b0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20d59a;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c25c8,DAT_004c25d0 + DAT_004c25c8);
  auStack_230._0_8_ = 0x20d5b6;
  __l_16._M_len = 2;
  __l_16._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_16,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20d5c5;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20d5e5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[14],_true>(&local_90,(char (*) [14])"DEPTH_TO_MASK",&local_200);
  auStack_230._0_8_ = 0x20d5f7;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20d607;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20d61d;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20d627;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20d631;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20d649;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20d653;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20d65d;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20d667;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20d68a;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20d69f;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20d6b7;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20d6dc;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = SCALAR_TEXTURE_COLORMAP;
  auStack_230._0_8_ = 0x20d706;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c25f0);
  auStack_230._0_8_ = 0x20d71a;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2608);
  auStack_230._0_8_ = 0x20d72e;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2620);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20d751;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2638,DAT_004c2640 + DAT_004c2638);
  auStack_230._0_8_ = 0x20d76d;
  __l_17._M_len = 2;
  __l_17._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_17,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20d77c;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20d79c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[24],_true>(&local_90,(char (*) [24])"SCALAR_TEXTURE_COLORMAP",&local_200);
  auStack_230._0_8_ = 0x20d7ae;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20d7be;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20d7d4;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20d7de;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20d7e8;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20d800;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20d80a;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20d814;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20d81e;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20d841;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_40);
  auStack_230._0_8_ = 0x20d856;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_48);
  auStack_230._0_8_ = 0x20d86e;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_50);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20d893;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2248,DAT_004c2250 + DAT_004c2248);
  local_170._0_4_ = BLUR_RGB;
  auStack_230._0_8_ = 0x20d8be;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2660);
  auStack_230._0_8_ = 0x20d8d3;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2678);
  auStack_230._0_8_ = 0x20d8e8;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2690);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20d90d;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c26a8,DAT_004c26b0 + DAT_004c26a8);
  auStack_230._0_8_ = 0x20d929;
  __l_18._M_len = 2;
  __l_18._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_18,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20d938;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20d958;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[9],_true>(&local_90,(char (*) [9])"BLUR_RGB",&local_200);
  auStack_230._0_8_ = 0x20d96a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20d97a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20d990;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20d99a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20d9a4;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20d9bc;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20d9c6;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20d9d0;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20d9da;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TRANSFORMATION_GIZMO_ROT_VERT;
  auStack_230._0_8_ = 0x20da01;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2f28);
  auStack_230._0_8_ = 0x20da13;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2f40);
  auStack_230._0_8_ = 0x20da28;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2f58);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20da4d;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c2f70,DAT_004c2f78 + DAT_004c2f70);
  local_170._0_4_ = TRANSFORMATION_GIZMO_ROT_FRAG;
  auStack_230._0_8_ = 0x20da77;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c2f98);
  auStack_230._0_8_ = 0x20da8b;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c2fb0);
  auStack_230._0_8_ = 0x20da9f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c2fc8);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20dac2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c2fe0,DAT_004c2fe8 + DAT_004c2fe0);
  auStack_230._0_8_ = 0x20dadb;
  __l_19._M_len = 2;
  __l_19._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220,__l_19,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20daea;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)local_220);
  pGVar3 = local_38;
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20db12;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[25],_true>(&local_90,(char (*) [25])"TRANSFORMATION_GIZMO_ROT",&local_200);
  auStack_230._0_8_ = 0x20db24;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_208,&local_90);
  auStack_230._0_8_ = 0x20db34;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20db4a;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20db54;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20db5e;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)local_220);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20db76;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20db80;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)(local_220 + lVar4 + 8));
    auStack_230._0_8_ = 0x20db8a;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20db94;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  puVar5 = &pGVar3->registeredShaderRules;
  auStack_230._0_8_ = 0x20dbbc;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [13])"GLSL_VERSION",(ShaderReplacementRule *)GLSL_VERSION);
  auStack_230._0_8_ = 0x20dbc7;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20dbd4;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20dbe1;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20dbee;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20dbfe;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  pSVar1 = (pointer)(local_1c0 + 0x10);
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20dc11;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20dc24;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20dc3f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"GLOBAL_FRAGMENT_FILTER",
             (ShaderReplacementRule *)GLOBAL_FRAGMENT_FILTER);
  auStack_230._0_8_ = 0x20dc4a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20dc57;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20dc64;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20dc71;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20dc81;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20dc8f;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20dc9e;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20dcb9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"DOWNSAMPLE_RESOLVE_1",
             (ShaderReplacementRule *)DOWNSAMPLE_RESOLVE_1);
  auStack_230._0_8_ = 0x20dcc4;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20dcd1;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20dcde;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20dceb;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20dcfb;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20dd09;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20dd18;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20dd33;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"DOWNSAMPLE_RESOLVE_2",
             (ShaderReplacementRule *)DOWNSAMPLE_RESOLVE_2);
  auStack_230._0_8_ = 0x20dd3e;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20dd4b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20dd58;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20dd65;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20dd75;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20dd83;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20dd92;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ddad;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"DOWNSAMPLE_RESOLVE_3",
             (ShaderReplacementRule *)DOWNSAMPLE_RESOLVE_3);
  auStack_230._0_8_ = 0x20ddb8;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ddc5;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ddd2;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20dddf;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ddef;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ddfd;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20de0c;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20de27;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"DOWNSAMPLE_RESOLVE_4",
             (ShaderReplacementRule *)DOWNSAMPLE_RESOLVE_4);
  auStack_230._0_8_ = 0x20de32;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20de3f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20de4c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20de59;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20de69;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20de77;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20de86;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20dea1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"TRANSPARENCY_STRUCTURE",
             (ShaderReplacementRule *)TRANSPARENCY_STRUCTURE);
  auStack_230._0_8_ = 0x20deac;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20deb9;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20dec6;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ded3;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20dee3;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20def1;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20df00;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20df1b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[28],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [28])"TRANSPARENCY_RESOLVE_SIMPLE",
             (ShaderReplacementRule *)TRANSPARENCY_RESOLVE_SIMPLE);
  auStack_230._0_8_ = 0x20df26;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20df33;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20df40;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20df4d;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20df5d;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20df6b;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20df7a;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20df95;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[28],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [28])"TRANSPARENCY_PEEL_STRUCTURE",
             (ShaderReplacementRule *)TRANSPARENCY_PEEL_STRUCTURE);
  auStack_230._0_8_ = 0x20dfa0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20dfad;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20dfba;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20dfc7;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20dfd7;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20dfe5;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20dff4;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e00f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [25])"TRANSPARENCY_PEEL_GROUND",
             (ShaderReplacementRule *)TRANSPARENCY_PEEL_GROUND);
  auStack_230._0_8_ = 0x20e01a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e027;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e034;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e041;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e051;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e05f;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e06e;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e089;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[19],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [19])"GENERATE_WORLD_POS",
             (ShaderReplacementRule *)GENERATE_WORLD_POS);
  auStack_230._0_8_ = 0x20e094;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e0a1;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e0ae;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e0bb;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e0cb;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e0d9;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e0e8;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e103;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [20])"CULL_POS_FROM_WORLD",
             (ShaderReplacementRule *)CULL_POS_FROM_WORLD);
  auStack_230._0_8_ = 0x20e10e;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e11b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e128;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e135;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e145;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e153;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e162;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e17d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[19],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [19])"CULL_POS_FROM_ATTR",
             (ShaderReplacementRule *)CULL_POS_FROM_ATTR);
  auStack_230._0_8_ = 0x20e188;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e195;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e1a2;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e1af;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e1bf;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e1cd;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e1dc;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e1f7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [13])"LIGHT_MATCAP",(ShaderReplacementRule *)LIGHT_MATCAP);
  auStack_230._0_8_ = 0x20e202;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e20f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e21c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e229;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e239;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e247;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e256;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e271;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [15])"LIGHT_PASSTHRU",(ShaderReplacementRule *)LIGHT_PASSTHRU);
  auStack_230._0_8_ = 0x20e27c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e289;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e296;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e2a3;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e2b3;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e2c1;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e2d0;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e2eb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[16],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [16])"SHADE_BASECOLOR",(ShaderReplacementRule *)SHADE_BASECOLOR)
  ;
  auStack_230._0_8_ = 0x20e2f6;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e303;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e310;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e31d;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e32d;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e33b;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e34a;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e365;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[12],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [12])0x423d33,(ShaderReplacementRule *)SHADE_COLOR);
  auStack_230._0_8_ = 0x20e370;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e37d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e38a;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e397;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e3a7;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e3b5;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e3c4;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e3df;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"SHADE_COLORMAP_VALUE",
             (ShaderReplacementRule *)SHADE_COLORMAP_VALUE);
  auStack_230._0_8_ = 0x20e3ea;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e3f7;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e404;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e411;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e421;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e42f;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e43e;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e459;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [24])"SHADE_COLORMAP_ANGULAR2",
             (ShaderReplacementRule *)SHADE_COLORMAP_ANGULAR2);
  auStack_230._0_8_ = 0x20e464;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e471;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e47e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e48b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e49b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e4a9;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e4b8;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e4d3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[18],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [18])"SHADE_GRID_VALUE2",
             (ShaderReplacementRule *)SHADE_GRID_VALUE2);
  auStack_230._0_8_ = 0x20e4de;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e4eb;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e4f8;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e505;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e515;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e523;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e532;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e54d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"SHADE_CHECKER_VALUE2",
             (ShaderReplacementRule *)SHADE_CHECKER_VALUE2);
  auStack_230._0_8_ = 0x20e558;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e565;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e572;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e57f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e58f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e59d;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e5ac;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e5c7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[22],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [22])"SHADEVALUE_MAG_VALUE2",
             (ShaderReplacementRule *)SHADEVALUE_MAG_VALUE2);
  auStack_230._0_8_ = 0x20e5d2;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e5df;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e5ec;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e5f9;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e609;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e617;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e626;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e641;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[26],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [26])"ISOLINE_STRIPE_VALUECOLOR",
             (ShaderReplacementRule *)ISOLINE_STRIPE_VALUECOLOR);
  auStack_230._0_8_ = 0x20e64c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e659;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e666;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e673;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e683;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e691;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e6a0;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e6bb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [20])"CHECKER_VALUE2COLOR",
             (ShaderReplacementRule *)CHECKER_VALUE2COLOR);
  auStack_230._0_8_ = 0x20e6c6;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e6d3;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e6e0;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e6ed;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e6fd;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e70b;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e71a;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e735;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [15])"MESH_WIREFRAME",(ShaderReplacementRule *)MESH_WIREFRAME);
  auStack_230._0_8_ = 0x20e740;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e74d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e75a;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e767;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e777;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e785;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e794;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e7af;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[26],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [26])"MESH_BACKFACE_NORMAL_FLIP",
             (ShaderReplacementRule *)MESH_BACKFACE_NORMAL_FLIP);
  auStack_230._0_8_ = 0x20e7ba;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e7c7;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e7d4;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e7e1;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e7f1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e7ff;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e80e;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e829;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"MESH_BACKFACE_DARKEN",
             (ShaderReplacementRule *)MESH_BACKFACE_DARKEN);
  auStack_230._0_8_ = 0x20e834;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e841;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e84e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e85b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e86b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e879;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e888;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e8a3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"MESH_PROPAGATE_VALUE",
             (ShaderReplacementRule *)MESH_PROPAGATE_VALUE);
  auStack_230._0_8_ = 0x20e8ae;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e8bb;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e8c8;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e8d5;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e8e5;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e8f3;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e902;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e91d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[22],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [22])"MESH_PROPAGATE_VALUE2",
             (ShaderReplacementRule *)MESH_PROPAGATE_VALUE2);
  auStack_230._0_8_ = 0x20e928;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e935;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e942;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e94f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e95f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e96d;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e97c;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20e997;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"MESH_PROPAGATE_COLOR",
             (ShaderReplacementRule *)MESH_PROPAGATE_COLOR);
  auStack_230._0_8_ = 0x20e9a2;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20e9af;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20e9bc;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20e9c9;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20e9d9;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20e9e7;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20e9f6;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ea11;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[30],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [30])"MESH_PROPAGATE_HALFEDGE_VALUE",
             (ShaderReplacementRule *)MESH_PROPAGATE_HALFEDGE_VALUE);
  auStack_230._0_8_ = 0x20ea1c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ea29;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ea36;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ea43;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ea53;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ea61;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ea70;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ea8b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [20])"MESH_PROPAGATE_PICK",
             (ShaderReplacementRule *)MESH_PROPAGATE_PICK);
  auStack_230._0_8_ = 0x20ea96;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20eaa3;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20eab0;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20eabd;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20eacd;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20eadb;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20eaea;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20eb05;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"SPHERE_PROPAGATE_VALUE",
             (ShaderReplacementRule *)SPHERE_PROPAGATE_VALUE);
  auStack_230._0_8_ = 0x20eb10;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20eb1d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20eb2a;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20eb37;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20eb47;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20eb55;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20eb64;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20eb7f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [24])"SPHERE_PROPAGATE_VALUE2",
             (ShaderReplacementRule *)SPHERE_PROPAGATE_VALUE2);
  auStack_230._0_8_ = 0x20eb8a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20eb97;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20eba4;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ebb1;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ebc1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ebcf;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ebde;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ebf9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"SPHERE_PROPAGATE_COLOR",
             (ShaderReplacementRule *)SPHERE_PROPAGATE_COLOR);
  auStack_230._0_8_ = 0x20ec04;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ec11;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ec1e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ec2b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ec3b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ec49;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ec58;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ec73;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"SPHERE_VARIABLE_SIZE",
             (ShaderReplacementRule *)SPHERE_VARIABLE_SIZE);
  auStack_230._0_8_ = 0x20ec7e;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ec8b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ec98;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20eca5;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ecb5;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ecc3;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ecd2;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20eced;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"VECTOR_PROPAGATE_COLOR",
             (ShaderReplacementRule *)VECTOR_PROPAGATE_COLOR);
  auStack_230._0_8_ = 0x20ecf8;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ed05;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ed12;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ed1f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ed2f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ed3d;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ed4c;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ed67;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [25])"TRANSFORMATION_GIZMO_VEC",
             (ShaderReplacementRule *)TRANSFORMATION_GIZMO_VEC);
  auStack_230._0_8_ = 0x20ed72;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ed7f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ed8c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ed99;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20eda9;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20edb7;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20edc6;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ede1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [25])"CYLINDER_PROPAGATE_VALUE",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_VALUE);
  auStack_230._0_8_ = 0x20edec;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20edf9;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ee06;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ee13;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ee23;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ee31;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ee40;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ee5b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[31],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [31])"CYLINDER_PROPAGATE_BLEND_VALUE",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_BLEND_VALUE);
  auStack_230._0_8_ = 0x20ee66;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ee73;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ee80;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ee8d;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ee9d;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20eeab;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20eeba;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20eed5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [25])"CYLINDER_PROPAGATE_COLOR",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_COLOR);
  auStack_230._0_8_ = 0x20eee0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20eeed;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20eefa;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ef07;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ef17;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ef25;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ef34;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ef4f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[31],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [31])"CYLINDER_PROPAGATE_BLEND_COLOR",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_BLEND_COLOR);
  auStack_230._0_8_ = 0x20ef5a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ef67;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ef74;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ef81;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ef91;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ef9f;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20efae;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20efc9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [24])"CYLINDER_PROPAGATE_PICK",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_PICK);
  auStack_230._0_8_ = 0x20efd4;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20efe1;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20efee;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20effb;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20f00b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20f019;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20f028;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  return;
}

Assistant:

void GLEngine::populateDefaultShadersAndRules() {
  // Note: we use .insert({key, value}) rather than map[key] = value to support const members in the value.

  // clang-format off

  // == Load general base shaders
  registeredShaderPrograms.insert({"MESH", {{FLEX_MESH_VERT_SHADER, FLEX_MESH_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"RAYCAST_SPHERE", {{FLEX_SPHERE_VERT_SHADER, FLEX_SPHERE_GEOM_SHADER, FLEX_SPHERE_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"RAYCAST_VECTOR", {{FLEX_VECTOR_VERT_SHADER, FLEX_VECTOR_GEOM_SHADER, FLEX_VECTOR_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"RAYCAST_CYLINDER", {{FLEX_CYLINDER_VERT_SHADER, FLEX_CYLINDER_GEOM_SHADER, FLEX_CYLINDER_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"HISTOGRAM", {{HISTOGRAM_VERT_SHADER, HISTOGRAM_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_TILE", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_TILE_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_TILE_REFLECT", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_TILE_REFLECT_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_SHADOW", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_SHADOW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"MAP_LIGHT", {{TEXTURE_DRAW_VERT_SHADER, MAP_LIGHT_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"RIBBON", {{RIBBON_VERT_SHADER, RIBBON_GEOM_SHADER, RIBBON_FRAG_SHADER}, DrawMode::IndexedLineStripAdjacency}});
  registeredShaderPrograms.insert({"SLICE_PLANE", {{SLICE_PLANE_VERT_SHADER, SLICE_PLANE_FRAG_SHADER}, DrawMode::Triangles}});

  registeredShaderPrograms.insert({"TEXTURE_DRAW_PLAIN", {{TEXTURE_DRAW_VERT_SHADER, PLAIN_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_DOT3", {{TEXTURE_DRAW_VERT_SHADER, DOT3_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_MAP3", {{TEXTURE_DRAW_VERT_SHADER, MAP3_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_SPHEREBG", {{SPHEREBG_DRAW_VERT_SHADER, SPHEREBG_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"COMPOSITE_PEEL", {{TEXTURE_DRAW_VERT_SHADER, COMPOSITE_PEEL}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"DEPTH_COPY", {{TEXTURE_DRAW_VERT_SHADER, DEPTH_COPY}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"DEPTH_TO_MASK", {{TEXTURE_DRAW_VERT_SHADER, DEPTH_TO_MASK}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"SCALAR_TEXTURE_COLORMAP", {{TEXTURE_DRAW_VERT_SHADER, SCALAR_TEXTURE_COLORMAP}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"BLUR_RGB", {{TEXTURE_DRAW_VERT_SHADER, BLUR_RGB}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TRANSFORMATION_GIZMO_ROT", {{TRANSFORMATION_GIZMO_ROT_VERT, TRANSFORMATION_GIZMO_ROT_FRAG}, DrawMode::Triangles}});

  // === Load rules

  // Utility rules
  registeredShaderRules.insert({"GLSL_VERSION", GLSL_VERSION});
  registeredShaderRules.insert({"GLOBAL_FRAGMENT_FILTER", GLOBAL_FRAGMENT_FILTER});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_1", DOWNSAMPLE_RESOLVE_1});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_2", DOWNSAMPLE_RESOLVE_2});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_3", DOWNSAMPLE_RESOLVE_3});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_4", DOWNSAMPLE_RESOLVE_4});
  
  registeredShaderRules.insert({"TRANSPARENCY_STRUCTURE", TRANSPARENCY_STRUCTURE});
  registeredShaderRules.insert({"TRANSPARENCY_RESOLVE_SIMPLE", TRANSPARENCY_RESOLVE_SIMPLE});
  registeredShaderRules.insert({"TRANSPARENCY_PEEL_STRUCTURE", TRANSPARENCY_PEEL_STRUCTURE});
  registeredShaderRules.insert({"TRANSPARENCY_PEEL_GROUND", TRANSPARENCY_PEEL_GROUND});
  
  registeredShaderRules.insert({"GENERATE_WORLD_POS", GENERATE_WORLD_POS});
  registeredShaderRules.insert({"CULL_POS_FROM_WORLD", CULL_POS_FROM_WORLD});
  registeredShaderRules.insert({"CULL_POS_FROM_ATTR", CULL_POS_FROM_ATTR});

  // Lighting and shading things
  registeredShaderRules.insert({"LIGHT_MATCAP", LIGHT_MATCAP});
  registeredShaderRules.insert({"LIGHT_PASSTHRU", LIGHT_PASSTHRU});
  registeredShaderRules.insert({"SHADE_BASECOLOR", SHADE_BASECOLOR});
  registeredShaderRules.insert({"SHADE_COLOR", SHADE_COLOR});
  registeredShaderRules.insert({"SHADE_COLORMAP_VALUE", SHADE_COLORMAP_VALUE});
  registeredShaderRules.insert({"SHADE_COLORMAP_ANGULAR2", SHADE_COLORMAP_ANGULAR2});
  registeredShaderRules.insert({"SHADE_GRID_VALUE2", SHADE_GRID_VALUE2});
  registeredShaderRules.insert({"SHADE_CHECKER_VALUE2", SHADE_CHECKER_VALUE2});
  registeredShaderRules.insert({"SHADEVALUE_MAG_VALUE2", SHADEVALUE_MAG_VALUE2});
  registeredShaderRules.insert({"ISOLINE_STRIPE_VALUECOLOR", ISOLINE_STRIPE_VALUECOLOR});
  registeredShaderRules.insert({"CHECKER_VALUE2COLOR", CHECKER_VALUE2COLOR});

  // mesh things
  registeredShaderRules.insert({"MESH_WIREFRAME", MESH_WIREFRAME});
  registeredShaderRules.insert({"MESH_BACKFACE_NORMAL_FLIP", MESH_BACKFACE_NORMAL_FLIP});
  registeredShaderRules.insert({"MESH_BACKFACE_DARKEN", MESH_BACKFACE_DARKEN});
  registeredShaderRules.insert({"MESH_PROPAGATE_VALUE", MESH_PROPAGATE_VALUE});
  registeredShaderRules.insert({"MESH_PROPAGATE_VALUE2", MESH_PROPAGATE_VALUE2});
  registeredShaderRules.insert({"MESH_PROPAGATE_COLOR", MESH_PROPAGATE_COLOR});
  registeredShaderRules.insert({"MESH_PROPAGATE_HALFEDGE_VALUE", MESH_PROPAGATE_HALFEDGE_VALUE});
  registeredShaderRules.insert({"MESH_PROPAGATE_PICK", MESH_PROPAGATE_PICK});

  // sphere things
  registeredShaderRules.insert({"SPHERE_PROPAGATE_VALUE", SPHERE_PROPAGATE_VALUE});
  registeredShaderRules.insert({"SPHERE_PROPAGATE_VALUE2", SPHERE_PROPAGATE_VALUE2});
  registeredShaderRules.insert({"SPHERE_PROPAGATE_COLOR", SPHERE_PROPAGATE_COLOR});
  registeredShaderRules.insert({"SPHERE_VARIABLE_SIZE", SPHERE_VARIABLE_SIZE});

  // vector things
  registeredShaderRules.insert({"VECTOR_PROPAGATE_COLOR", VECTOR_PROPAGATE_COLOR});
  registeredShaderRules.insert({"TRANSFORMATION_GIZMO_VEC", TRANSFORMATION_GIZMO_VEC});

  // cylinder things
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_VALUE", CYLINDER_PROPAGATE_VALUE});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_BLEND_VALUE", CYLINDER_PROPAGATE_BLEND_VALUE});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_COLOR", CYLINDER_PROPAGATE_COLOR});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_BLEND_COLOR", CYLINDER_PROPAGATE_BLEND_COLOR});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_PICK", CYLINDER_PROPAGATE_PICK});

  // clang-format on
}